

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O2

void __thiscall
embree::OBJMaterial::OBJMaterial
          (OBJMaterial *this,float d,Vec3fa *Kd,Vec3fa *Ks,float Ns,string *name)

{
  undefined8 uVar1;
  allocator local_49;
  float local_48;
  float local_44;
  string local_40;
  
  local_48 = d;
  local_44 = Ns;
  std::__cxx11::string::string((string *)&local_40,"",&local_49);
  SceneGraph::MaterialNode::MaterialNode(&this->super_MaterialNode,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__OBJMaterial_002a6ac8;
  (this->base).type = 0;
  this->illum = 0;
  this->d = local_48;
  this->Ns = local_44;
  this->Ni = 1.0;
  *(undefined8 *)&(this->Ka).field_0 = 0;
  *(undefined8 *)((long)&(this->Ka).field_0 + 8) = 0;
  uVar1 = *(undefined8 *)((long)&Kd->field_0 + 8);
  *(undefined8 *)&(this->Kd).field_0 = *(undefined8 *)&Kd->field_0;
  *(undefined8 *)((long)&(this->Kd).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&Ks->field_0 + 8);
  *(undefined8 *)&(this->Ks).field_0 = *(undefined8 *)&Ks->field_0;
  *(undefined8 *)((long)&(this->Ks).field_0 + 8) = uVar1;
  *(undefined8 *)&(this->Kt).field_0 = 0x3f8000003f800000;
  *(undefined8 *)((long)&(this->Kt).field_0 + 8) = 0x3f8000003f800000;
  memset(&this->map_d,0,0xa8);
  return;
}

Assistant:

OBJMaterial (float d, const Vec3fa& Kd, const Vec3fa& Ks, const float Ns, const std::string name = "")
      : base(MATERIAL_OBJ), illum(0), d(d), Ns(Ns), Ni(1.f), Ka(0.f), Kd(Kd), Ks(Ks), Kt(1.0f),
        map_d(nullptr), map_Ka(nullptr), map_Kd(nullptr), map_Ks(nullptr), map_Kt(nullptr), map_Ns(nullptr), map_Displ(nullptr) {}